

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

COMPONENT_TYPE Diligent::ValueTypeToComponentType(VALUE_TYPE ValType,bool IsNormalized,bool IsSRGB)

{
  undefined7 in_register_00000039;
  ulong uVar1;
  string msg;
  string local_28;
  
  uVar1 = CONCAT71(in_register_00000039,ValType);
  switch(uVar1 & 0xffffffff) {
  case 0:
  case 6:
    break;
  case 1:
  case 2:
    uVar1 = (ulong)((uint)!IsNormalized * 3 + 2);
    break;
  case 3:
    uVar1 = 5;
    break;
  case 4:
    uVar1 = 6;
    if (IsNormalized) {
      uVar1 = (ulong)(byte)(IsSRGB + 3);
    }
    break;
  case 5:
    uVar1 = (ulong)((uint)!IsNormalized * 3 + 3);
    break;
  case 7:
  case 8:
  case 9:
    uVar1 = 1;
    break;
  default:
    FormatString<char[19]>(&local_28,(char (*) [19])"Unknown value type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"ValueTypeToComponentType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x1e1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    uVar1 = 0;
  }
  return (COMPONENT_TYPE)uVar1;
}

Assistant:

COMPONENT_TYPE ValueTypeToComponentType(VALUE_TYPE ValType, bool IsNormalized, bool IsSRGB)
{
    static_assert(VT_NUM_TYPES == 10, "Please handle the new value type below");
    switch (ValType)
    {
        case VT_UNDEFINED: return COMPONENT_TYPE_UNDEFINED;

        case VT_UINT8:
            return IsNormalized ? (IsSRGB ? COMPONENT_TYPE_UNORM_SRGB : COMPONENT_TYPE_UNORM) : COMPONENT_TYPE_UINT;

        case VT_UINT16:
            return IsNormalized ? COMPONENT_TYPE_UNORM : COMPONENT_TYPE_UINT;

        case VT_INT8:
        case VT_INT16:
            return IsNormalized ? COMPONENT_TYPE_SNORM : COMPONENT_TYPE_SINT;

        case VT_INT32:
            return COMPONENT_TYPE_SINT;

        case VT_UINT32:
            return COMPONENT_TYPE_UINT;

        case VT_FLOAT16:
        case VT_FLOAT32:
        case VT_FLOAT64:
            return COMPONENT_TYPE_FLOAT;

        default:
            UNEXPECTED("Unknown value type");
            return COMPONENT_TYPE_UNDEFINED;
    }
}